

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operations.cpp
# Opt level: O3

bool duckdb::TemplatedBooleanOperation<duckdb::Equals>(Value *left,Value *right)

{
  PhysicalType PVar1;
  size_t __n;
  element_type *peVar2;
  element_type *peVar3;
  bool bVar4;
  bool bVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint16_t uVar8;
  uint16_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  int iVar12;
  vector<duckdb::Value,_true> *pvVar13;
  vector<duckdb::Value,_true> *pvVar14;
  const_reference pvVar15;
  const_reference pvVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  long lVar19;
  string *psVar20;
  string *psVar21;
  InternalException *this;
  long lVar22;
  long lVar23;
  long lVar24;
  size_type sVar25;
  hugeint_t hVar26;
  hugeint_t hVar27;
  interval_t iVar28;
  interval_t iVar29;
  LogicalType LStack_c8;
  Value local_b0;
  Value local_70;
  
LAB_00e11c2b:
  bVar4 = LogicalType::operator==(&left->type_,&right->type_);
  peVar3 = local_70.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2 = local_b0.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (!bVar4) {
    Value::Value(&local_b0,left);
    Value::Value(&local_70,right);
    LogicalType::ForceMaxLogicalType(&LStack_c8,&left->type_,&right->type_);
    bVar4 = Value::DefaultTryCastAs(&local_b0,&LStack_c8,false);
    if ((bVar4) && (bVar4 = Value::DefaultTryCastAs(&local_70,&LStack_c8,false), bVar4)) {
      bVar4 = TemplatedBooleanOperation<duckdb::Equals>(&local_b0,&local_70);
    }
    else {
      bVar4 = false;
    }
    LogicalType::~LogicalType(&LStack_c8);
    Value::~Value(&local_70);
    Value::~Value(&local_b0);
    return bVar4;
  }
  PVar1 = (left->type_).physical_type_;
  local_b0.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  if (199 < PVar1) {
    if (PVar1 == VARCHAR) {
      psVar20 = StringValue::Get_abi_cxx11_(left);
      psVar21 = StringValue::Get_abi_cxx11_(right);
      __n = psVar20->_M_string_length;
      if (__n != psVar21->_M_string_length) {
        return false;
      }
      if (__n == 0) {
        return true;
      }
      iVar12 = bcmp((psVar20->_M_dataplus)._M_p,(psVar21->_M_dataplus)._M_p,__n);
      return iVar12 == 0;
    }
    if (PVar1 == UINT128) {
      local_b0.type_._0_16_ = Value::GetValueUnsafe<duckdb::uhugeint_t>(left);
      local_70.type_._0_16_ = Value::GetValueUnsafe<duckdb::uhugeint_t>(right);
      bVar4 = uhugeint_t::operator==((uhugeint_t *)&local_b0,(uhugeint_t *)&local_70);
      return bVar4;
    }
    if (PVar1 == INT128) {
      hVar26 = Value::GetValueUnsafe<duckdb::hugeint_t>(left);
      hVar27 = Value::GetValueUnsafe<duckdb::hugeint_t>(right);
      return SUB168((undefined1  [16])hVar26 ^ (undefined1  [16])hVar27,8) == 0 &&
             SUB168((undefined1  [16])hVar26 ^ (undefined1  [16])hVar27,0) == 0;
    }
switchD_00e11c61_caseD_a:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_b0.type_._0_8_ =
         (uhugeint_t *)
         &local_b0.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"Unimplemented type for value comparison","");
    InternalException::InternalException(this,(string *)&local_b0);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  switch(PVar1) {
  case BOOL:
    bVar4 = Value::GetValueUnsafe<bool>(left);
    bVar5 = Value::GetValueUnsafe<bool>(right);
    return bVar5 == bVar4;
  case UINT8:
    uVar6 = Value::GetValueUnsafe<unsigned_char>(left);
    uVar7 = Value::GetValueUnsafe<unsigned_char>(right);
    break;
  case INT8:
    uVar6 = Value::GetValueUnsafe<signed_char>(left);
    uVar7 = Value::GetValueUnsafe<signed_char>(right);
    break;
  case UINT16:
    uVar8 = Value::GetValueUnsafe<unsigned_short>(left);
    uVar9 = Value::GetValueUnsafe<unsigned_short>(right);
    goto LAB_00e11f54;
  case INT16:
    uVar8 = Value::GetValueUnsafe<short>(left);
    uVar9 = Value::GetValueUnsafe<short>(right);
LAB_00e11f54:
    return uVar8 == uVar9;
  case UINT32:
    uVar10 = Value::GetValueUnsafe<unsigned_int>(left);
    uVar11 = Value::GetValueUnsafe<unsigned_int>(right);
    goto LAB_00e11fa3;
  case INT32:
    uVar10 = Value::GetValueUnsafe<int>(left);
    uVar11 = Value::GetValueUnsafe<int>(right);
LAB_00e11fa3:
    return uVar10 == uVar11;
  case UINT64:
    uVar17 = Value::GetValueUnsafe<unsigned_long>(left);
    uVar18 = Value::GetValueUnsafe<unsigned_long>(right);
    goto LAB_00e11f6f;
  case INT64:
    uVar17 = Value::GetValueUnsafe<long>(left);
    uVar18 = Value::GetValueUnsafe<long>(right);
LAB_00e11f6f:
    return uVar17 == uVar18;
  default:
    goto switchD_00e11c61_caseD_a;
  case FLOAT:
    local_b0.type_._0_4_ = Value::GetValueUnsafe<float>(left);
    local_70.type_._0_4_ = Value::GetValueUnsafe<float>(right);
    bVar4 = Equals::Operation<float>((float *)&local_b0,(float *)&local_70);
    return bVar4;
  case DOUBLE:
    local_70.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
    local_b0.type_._0_8_ = Value::GetValueUnsafe<double>(left);
    local_70.type_._0_8_ = Value::GetValueUnsafe<double>(right);
    bVar4 = Equals::Operation<double>((double *)&local_b0,(double *)&local_70);
    return bVar4;
  case INTERVAL:
    iVar28 = Value::GetValueUnsafe<duckdb::interval_t>(left);
    lVar19 = iVar28.micros;
    iVar29 = Value::GetValueUnsafe<duckdb::interval_t>(right);
    lVar22 = iVar29.micros;
    iVar12 = iVar29.days;
    if (((iVar28.months == iVar29.months) && (iVar28.days == iVar12)) &&
       (iVar12 = iVar28.days, lVar19 == lVar22)) {
      return true;
    }
    lVar23 = (iVar28._0_8_ >> 0x20) + lVar19 / 86400000000;
    lVar24 = (long)iVar12 + lVar22 / 86400000000;
    if ((long)iVar28.months + lVar23 / 0x1e != (long)iVar29.months + lVar24 / 0x1e) {
      return false;
    }
    if (lVar23 % 0x1e == lVar24 % 0x1e) {
      return lVar19 % 86400000000 == lVar22 % 86400000000;
    }
    return false;
  case LIST:
    pvVar13 = ListValue::GetChildren(left);
    pvVar14 = ListValue::GetChildren(right);
    lVar19 = (long)(pvVar13->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pvVar13->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (lVar19 == 0) {
      lVar19 = 0;
    }
    else if ((pvVar14->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_finish !=
             (pvVar14->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_start) {
      sVar25 = 0;
      do {
        vector<duckdb::Value,_true>::operator[](pvVar13,sVar25);
        vector<duckdb::Value,_true>::operator[](pvVar14,sVar25);
        pvVar15 = vector<duckdb::Value,_true>::operator[](pvVar13,sVar25);
        pvVar16 = vector<duckdb::Value,_true>::operator[](pvVar14,sVar25);
        if (((pvVar15->is_null != true) || ((pvVar16->is_null & 1U) == 0)) &&
           ((pvVar15->is_null != pvVar16->is_null ||
            (bVar4 = TemplatedBooleanOperation<duckdb::Equals>(pvVar15,pvVar16), !bVar4)))) {
          return false;
        }
        lVar19 = (long)(pvVar13->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pvVar13->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                       super__Vector_impl_data._M_start;
        sVar25 = sVar25 + 1;
      } while ((sVar25 != lVar19 >> 6) &&
              (sVar25 != (long)(pvVar14->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>
                               ).super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar14->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>
                               ).super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 6));
    }
    return lVar19 == (long)(pvVar14->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(pvVar14->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl
                           .super__Vector_impl_data._M_start;
  case STRUCT:
    goto switchD_00e11c61_caseD_18;
  case ARRAY:
    pvVar13 = ArrayValue::GetChildren(left);
    pvVar14 = ArrayValue::GetChildren(right);
    if ((pvVar13->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (pvVar13->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start) {
      return true;
    }
    sVar25 = 0;
    do {
      vector<duckdb::Value,_true>::operator[](pvVar13,sVar25);
      vector<duckdb::Value,_true>::operator[](pvVar14,sVar25);
      pvVar15 = vector<duckdb::Value,_true>::operator[](pvVar13,sVar25);
      pvVar16 = vector<duckdb::Value,_true>::operator[](pvVar14,sVar25);
      if ((pvVar15->is_null != true) || ((pvVar16->is_null & 1U) == 0)) {
        if (pvVar15->is_null != pvVar16->is_null) {
          return false;
        }
        bVar4 = TemplatedBooleanOperation<duckdb::Equals>(pvVar15,pvVar16);
        if (!bVar4) {
          return false;
        }
      }
      sVar25 = sVar25 + 1;
      if ((ulong)((long)(pvVar13->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(pvVar13->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                        super__Vector_impl_data._M_start >> 6) <= sVar25) {
        return true;
      }
    } while( true );
  }
  return uVar6 == uVar7;
switchD_00e11c61_caseD_18:
  pvVar13 = StructValue::GetChildren(left);
  pvVar14 = StructValue::GetChildren(right);
  sVar25 = 0;
  if ((long)(pvVar13->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pvVar13->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_start != 0x40) {
    do {
      vector<duckdb::Value,_true>::operator[](pvVar13,sVar25);
      vector<duckdb::Value,_true>::operator[](pvVar14,sVar25);
      pvVar15 = vector<duckdb::Value,_true>::operator[](pvVar13,sVar25);
      pvVar16 = vector<duckdb::Value,_true>::operator[](pvVar14,sVar25);
      if ((pvVar15->is_null != true) || ((pvVar16->is_null & 1U) == 0)) {
        if (pvVar15->is_null != pvVar16->is_null) {
          return false;
        }
        bVar4 = TemplatedBooleanOperation<duckdb::Equals>(pvVar15,pvVar16);
        if (!bVar4) {
          return false;
        }
      }
      sVar25 = sVar25 + 1;
    } while (sVar25 < ((long)(pvVar13->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(pvVar13->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 6) - 1U);
  }
  left = vector<duckdb::Value,_true>::operator[](pvVar13,sVar25);
  right = vector<duckdb::Value,_true>::operator[](pvVar14,sVar25);
  if ((left->is_null == true) && ((right->is_null & 1U) != 0)) {
    return true;
  }
  if (left->is_null != right->is_null) {
    return false;
  }
  goto LAB_00e11c2b;
}

Assistant:

static bool TemplatedBooleanOperation(const Value &left, const Value &right) {
	const auto &left_type = left.type();
	const auto &right_type = right.type();
	if (left_type != right_type) {
		Value left_copy = left;
		Value right_copy = right;

		auto comparison_type = LogicalType::ForceMaxLogicalType(left_type, right_type);
		if (!left_copy.DefaultTryCastAs(comparison_type) || !right_copy.DefaultTryCastAs(comparison_type)) {
			return false;
		}
		D_ASSERT(left_copy.type() == right_copy.type());
		return TemplatedBooleanOperation<OP>(left_copy, right_copy);
	}
	switch (left_type.InternalType()) {
	case PhysicalType::BOOL:
		return OP::Operation(left.GetValueUnsafe<bool>(), right.GetValueUnsafe<bool>());
	case PhysicalType::INT8:
		return OP::Operation(left.GetValueUnsafe<int8_t>(), right.GetValueUnsafe<int8_t>());
	case PhysicalType::INT16:
		return OP::Operation(left.GetValueUnsafe<int16_t>(), right.GetValueUnsafe<int16_t>());
	case PhysicalType::INT32:
		return OP::Operation(left.GetValueUnsafe<int32_t>(), right.GetValueUnsafe<int32_t>());
	case PhysicalType::INT64:
		return OP::Operation(left.GetValueUnsafe<int64_t>(), right.GetValueUnsafe<int64_t>());
	case PhysicalType::UINT8:
		return OP::Operation(left.GetValueUnsafe<uint8_t>(), right.GetValueUnsafe<uint8_t>());
	case PhysicalType::UINT16:
		return OP::Operation(left.GetValueUnsafe<uint16_t>(), right.GetValueUnsafe<uint16_t>());
	case PhysicalType::UINT32:
		return OP::Operation(left.GetValueUnsafe<uint32_t>(), right.GetValueUnsafe<uint32_t>());
	case PhysicalType::UINT64:
		return OP::Operation(left.GetValueUnsafe<uint64_t>(), right.GetValueUnsafe<uint64_t>());
	case PhysicalType::UINT128:
		return OP::Operation(left.GetValueUnsafe<uhugeint_t>(), right.GetValueUnsafe<uhugeint_t>());
	case PhysicalType::INT128:
		return OP::Operation(left.GetValueUnsafe<hugeint_t>(), right.GetValueUnsafe<hugeint_t>());
	case PhysicalType::FLOAT:
		return OP::Operation(left.GetValueUnsafe<float>(), right.GetValueUnsafe<float>());
	case PhysicalType::DOUBLE:
		return OP::Operation(left.GetValueUnsafe<double>(), right.GetValueUnsafe<double>());
	case PhysicalType::INTERVAL:
		return OP::Operation(left.GetValueUnsafe<interval_t>(), right.GetValueUnsafe<interval_t>());
	case PhysicalType::VARCHAR:
		return OP::Operation(StringValue::Get(left), StringValue::Get(right));
	case PhysicalType::STRUCT: {
		auto &left_children = StructValue::GetChildren(left);
		auto &right_children = StructValue::GetChildren(right);
		// this should be enforced by the type
		D_ASSERT(left_children.size() == right_children.size());
		idx_t i = 0;
		for (; i < left_children.size() - 1; ++i) {
			if (ValuePositionComparator::Definite<OP>(left_children[i], right_children[i])) {
				return true;
			}
			if (!ValuePositionComparator::Possible<OP>(left_children[i], right_children[i])) {
				return false;
			}
		}
		return ValuePositionComparator::Final<OP>(left_children[i], right_children[i]);
	}
	case PhysicalType::LIST: {
		auto &left_children = ListValue::GetChildren(left);
		auto &right_children = ListValue::GetChildren(right);
		for (idx_t pos = 0;; ++pos) {
			if (pos == left_children.size() || pos == right_children.size()) {
				return ValuePositionComparator::TieBreak<OP>(left_children.size(), right_children.size());
			}
			if (ValuePositionComparator::Definite<OP>(left_children[pos], right_children[pos])) {
				return true;
			}
			if (!ValuePositionComparator::Possible<OP>(left_children[pos], right_children[pos])) {
				return false;
			}
		}
		return false;
	}
	case PhysicalType::ARRAY: {
		auto &left_children = ArrayValue::GetChildren(left);
		auto &right_children = ArrayValue::GetChildren(right);

		// Should be enforced by the type
		D_ASSERT(left_children.size() == right_children.size());

		for (idx_t i = 0; i < left_children.size(); i++) {
			if (ValuePositionComparator::Definite<OP>(left_children[i], right_children[i])) {
				return true;
			}
			if (!ValuePositionComparator::Possible<OP>(left_children[i], right_children[i])) {
				return false;
			}
		}
		return true;
	}
	default:
		throw InternalException("Unimplemented type for value comparison");
	}
}